

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  uint num_rects;
  ImFontAtlasCustomRect *pIVar1;
  long lVar2;
  unsigned_short *puVar3;
  int *piVar4;
  char *__function;
  stbrp_coord *psVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ImVector<stbrp_rect> pack_rects;
  stbrp_rect *psStack_30;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa40,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  num_rects = (atlas->CustomRects).Size;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0xa43,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  psStack_30 = (stbrp_rect *)0x0;
  if (0 < (int)num_rects) {
    uVar6 = 8;
    if (7 < (int)num_rects) {
      uVar6 = num_rects;
    }
    if (0 < (int)uVar6) {
      psStack_30 = (stbrp_rect *)ImGui::MemAlloc((ulong)uVar6 * 0x18);
    }
  }
  memset(psStack_30,0,(ulong)num_rects * 0x18);
  lVar2 = (long)(atlas->CustomRects).Size;
  if (0 < lVar2) {
    puVar3 = &((atlas->CustomRects).Data)->Height;
    psVar5 = &psStack_30->h;
    lVar7 = 0;
    do {
      if ((int)num_rects <= lVar7) goto LAB_001706f8;
      psVar5[-1] = (uint)((ImFontAtlasCustomRect *)(puVar3 + -1))->Width;
      if ((atlas->CustomRects).Size <= lVar7) goto LAB_0017070f;
      if ((int)num_rects <= lVar7) goto LAB_001706f8;
      *psVar5 = (uint)*puVar3;
      lVar7 = lVar7 + 1;
      puVar3 = puVar3 + 0x10;
      psVar5 = psVar5 + 6;
    } while (lVar2 != lVar7);
  }
  if (0 < (int)num_rects) {
    stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psStack_30,num_rects);
    if (0 < (long)(int)num_rects) {
      piVar4 = &psStack_30->was_packed;
      lVar2 = 6;
      lVar7 = 0;
      do {
        if (*piVar4 != 0) {
          if ((atlas->CustomRects).Size <= lVar7) goto LAB_0017070f;
          pIVar1 = (atlas->CustomRects).Data;
          *(short *)((long)pIVar1 + lVar2 + -2) = (short)piVar4[-2];
          if ((int)num_rects <= lVar7) goto LAB_001706f8;
          if ((atlas->CustomRects).Size <= lVar7) goto LAB_0017070f;
          iVar8 = piVar4[-1];
          *(short *)((long)&pIVar1->Width + lVar2) = (short)iVar8;
          if ((int)num_rects <= lVar7) goto LAB_001706f8;
          if ((atlas->CustomRects).Size <= lVar7) goto LAB_0017070f;
          if ((piVar4[-4] != (uint)*(ushort *)((long)pIVar1 + lVar2 + -6)) ||
             (piVar4[-3] != (uint)*(ushort *)((long)pIVar1 + lVar2 + -4))) {
            __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_draw.cpp"
                          ,0xa53,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
          }
          iVar8 = piVar4[-3] + iVar8;
          if (iVar8 < atlas->TexHeight) {
            iVar8 = atlas->TexHeight;
          }
          atlas->TexHeight = iVar8;
        }
        lVar7 = lVar7 + 1;
        piVar4 = piVar4 + 6;
        lVar2 = lVar2 + 0x20;
      } while ((int)num_rects != lVar7);
    }
    if (psStack_30 != (stbrp_rect *)0x0) {
      ImGui::MemFree(psStack_30);
    }
    return;
  }
LAB_001706f8:
  __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
LAB_00170724:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                ,0x703,__function);
LAB_0017070f:
  __function = "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]";
  goto LAB_00170724;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}